

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_input_key
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_handle_t handle)

{
  psa_status_t pVar1;
  psa_key_slot_t *ppStack_28;
  psa_status_t status;
  psa_key_slot_t *slot;
  psa_key_handle_t handle_local;
  psa_key_derivation_operation_t *ppStack_18;
  psa_key_derivation_step_t step_local;
  psa_key_derivation_operation_t *operation_local;
  
  slot._4_2_ = handle;
  slot._6_2_ = step;
  ppStack_18 = operation;
  pVar1 = psa_get_key_from_slot(handle,&stack0xffffffffffffffd8,0x1000,operation->alg);
  if (pVar1 == 0) {
    if (slot._6_2_ == 0x101) {
      ppStack_18->field_0x4 = ppStack_18->field_0x4 & 0xfe | 1;
    }
    operation_local._4_4_ =
         psa_key_derivation_input_internal
                   (ppStack_18,slot._6_2_,(ppStack_28->attr).type,(ppStack_28->data).raw.data,
                    (ppStack_28->data).raw.bytes);
  }
  else {
    psa_key_derivation_abort(ppStack_18);
    operation_local._4_4_ = pVar1;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_key_derivation_input_key(
    psa_key_derivation_operation_t *operation,
    psa_key_derivation_step_t step,
    psa_key_handle_t handle )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    status = psa_get_transparent_key( handle, &slot,
                                      PSA_KEY_USAGE_DERIVE,
                                      operation->alg );
    if( status != PSA_SUCCESS )
    {
        psa_key_derivation_abort( operation );
        return( status );
    }

    /* Passing a key object as a SECRET input unlocks the permission
     * to output to a key object. */
    if( step == PSA_KEY_DERIVATION_INPUT_SECRET )
        operation->can_output_key = 1;

    return( psa_key_derivation_input_internal( operation,
                                               step, slot->attr.type,
                                               slot->data.raw.data,
                                               slot->data.raw.bytes ) );
}